

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest-param-util.h
# Opt level: O0

Test * __thiscall
testing::internal::ParameterizedTestFactory<(anonymous_namespace)::AV1LbdInvTxfm2d_gt_int16_Test>::
CreateTest(ParameterizedTestFactory<(anonymous_namespace)::AV1LbdInvTxfm2d_gt_int16_Test> *this)

{
  Test *this_00;
  long in_RDI;
  
  WithParamInterface<std::tuple<void_(*const)(const_int_*,_unsigned_char_*,_int,_unsigned_char,_unsigned_char,_int)>_>
  ::SetParam((ParamType *)(in_RDI + 8));
  this_00 = (Test *)operator_new(0x20);
  anon_unknown.dwarf_efad74::AV1LbdInvTxfm2d_gt_int16_Test::AV1LbdInvTxfm2d_gt_int16_Test
            ((AV1LbdInvTxfm2d_gt_int16_Test *)this_00);
  return this_00;
}

Assistant:

Test* CreateTest() override {
    TestClass::SetParam(&parameter_);
    return new TestClass();
  }